

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

void cli::anon_unknown_4::addDirectory(ArchiveBuilder *archive,string *path,bool recursive)

{
  DIR *__dirp;
  dirent *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
LAB_001055af:
    pdVar1 = readdir(__dirp);
    if (pdVar1 != (dirent *)0x0) {
      if ((pdVar1->d_name[0] != '.') ||
         ((pdVar1->d_name[1] != '\0' && ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0'))))
         )) {
        if (pdVar1->d_type == '\x04') {
          if (!recursive) goto LAB_001055af;
          std::operator+(&local_70,path,'/');
          std::operator+(&local_50,&local_70,pdVar1->d_name);
          addDirectory(archive,&local_50,true);
        }
        else {
          std::operator+(&local_70,path,'/');
          std::operator+(&local_50,&local_70,pdVar1->d_name);
          addPath(archive,&local_50);
        }
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      goto LAB_001055af;
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void addDirectory(ZAP::ArchiveBuilder &archive, const std::string &path, bool recursive)
		{
		#ifdef _WIN32
			HANDLE dir;
			WIN32_FIND_DATAA ent;

			if ((dir = FindFirstFileA((path + "/*").c_str(), &ent)) != INVALID_HANDLE_VALUE)
			{
				do
				{
					if ((std::strcmp(ent.cFileName, ".") == 0) || (std::strcmp(ent.cFileName, "..") == 0))
						continue;

					if (ent.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent.cFileName, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent.cFileName);
					}
				} while (FindNextFileA(dir, &ent));

				FindClose(dir);
			}
		#else
			DIR *dir;
			struct dirent *ent;

			if ((dir = opendir(path.c_str())) != nullptr)
			{
				while ((ent = readdir(dir)) != nullptr)
				{
					if ((std::strcmp(ent->d_name, ".") == 0) || (std::strcmp(ent->d_name, "..") == 0))
						continue;

					if (ent->d_type == DT_DIR)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent->d_name, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent->d_name);
					}
				}

				closedir(dir);
			}
		#endif
		}